

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O2

void Nwk_ManDeriveMinCut(Gia_Man_t *p,int fVerbose)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  Nwk_Man_t *pNtk;
  Vec_Ptr_t *p_00;
  void *pvVar10;
  Gia_Obj_t *pObj;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int *piVar11;
  uint i;
  int *piVar12;
  int iVar13;
  Vec_Int_t *vPPis;
  Vec_Int_t *local_60;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *vMapInv;
  
  Gia_ManGlaCollect(p,p->vGateClasses,(Vec_Int_t **)0x0,&vPPis,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0);
  pVVar7 = Vec_IntAlloc(100);
  pVVar8 = Vec_IntAlloc(100);
  Gia_ManIncrementTravId(p);
  for (iVar13 = 0; iVar13 < vPPis->nSize; iVar13 = iVar13 + 1) {
    iVar4 = Vec_IntEntry(vPPis,iVar13);
    pGVar9 = Gia_ManObj(p,iVar4);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    Nwk_ManColleacReached_rec(p,pGVar9,pVVar7,pVVar8);
  }
  local_40 = pVVar8;
  pNtk = Nwk_ManCreateFromGia(p,vPPis,pVVar7,pVVar8,&vMapInv);
  iVar13 = Nwk_ManPiNum(pNtk);
  iVar4 = Nwk_ManPoNum(pNtk);
  if (iVar13 != iVar4) {
    __assert_fail("Nwk_ManPiNum(pNtk) == Nwk_ManPoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkAig.c"
                  ,0xed,"void Nwk_ManDeriveMinCut(Gia_Man_t *, int)");
  }
  uVar5 = Nwk_ManPiNum(pNtk);
  pGVar9 = (Gia_Obj_t *)(ulong)uVar5;
  p_00 = Nwk_ManRetimeCutBackward(pNtk,uVar5,fVerbose);
  local_60 = Vec_IntAlloc(100);
  local_50 = Vec_IntAlloc(100);
  Gia_ManIncrementTravId(p);
  iVar13 = 0;
  while( true ) {
    pVVar8 = local_60;
    uVar5 = (uint)pGVar9;
    if (p_00->nSize <= iVar13) break;
    pvVar10 = Vec_PtrEntry(p_00,iVar13);
    uVar5 = Vec_IntEntry(vMapInv,*(int *)((long)pvVar10 + 0x24));
    pGVar9 = (Gia_Obj_t *)(ulong)uVar5;
    pObj = Gia_ManObj(p,uVar5);
    if ((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) {
      Nwk_ManColleacReached_rec(p,pObj,local_60,local_50);
      pGVar9 = pObj;
    }
    iVar13 = iVar13 + 1;
  }
  if (fVerbose != 0) {
    uVar5 = vPPis->nSize + 1;
    printf("Min-cut: %d -> %d.  Nodes %d -> %d.  ",(ulong)uVar5,(ulong)(uint)p_00->nSize,
           (ulong)(uint)pVVar7->nSize,(ulong)(uint)local_60->nSize);
  }
  Vec_IntFree(vPPis);
  free(p_00->pArray);
  free(p_00);
  Vec_IntFree(vMapInv);
  Nwk_ManFree(pNtk);
  Vec_IntSort(pVVar7,uVar5);
  Vec_IntSort(pVVar8,uVar5);
  p_01 = Vec_IntAlloc(pVVar7->nSize);
  p_02 = Vec_IntAlloc(100);
  local_58 = Vec_IntAlloc(100);
  piVar11 = pVVar7->pArray;
  piVar12 = pVVar8->pArray;
  piVar1 = piVar11 + pVVar7->nSize;
  piVar2 = piVar12 + pVVar8->nSize;
  local_48 = pVVar7;
  do {
    while( true ) {
      if ((piVar1 <= piVar11) || (piVar2 <= piVar12)) {
        for (; pVVar7 = local_58, piVar11 < piVar1; piVar11 = piVar11 + 1) {
          Vec_IntPush(p_02,*piVar11);
        }
        for (; piVar12 < piVar2; piVar12 = piVar12 + 1) {
          Vec_IntPush(pVVar7,*piVar12);
        }
        if (fVerbose == 0) {
          uVar5 = p_02->nSize;
        }
        else {
          uVar5 = p_02->nSize;
          printf("Common = %d.  Diff0 = %d. Diff1 = %d.\n",(ulong)(uint)p_01->nSize,(ulong)uVar5,
                 (ulong)(uint)pVVar7->nSize);
        }
        i = 0;
        if ((int)uVar5 < 1) {
          uVar5 = 0;
          i = 0;
        }
        for (; uVar5 != i; i = i + 1) {
          uVar6 = Vec_IntEntry(p_02,i);
          if (((int)uVar6 < 0) || (p->vGateClasses->nSize <= (int)uVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          p->vGateClasses->pArray[uVar6] = 1;
        }
        Vec_IntFree(local_40);
        Vec_IntFree(local_48);
        Vec_IntFree(local_50);
        Vec_IntFree(local_60);
        Vec_IntFree(p_01);
        Vec_IntFree(p_02);
        Vec_IntFree(pVVar7);
        iVar13 = 0;
        while( true ) {
          if ((p->nObjs <= iVar13) || (pGVar9 = Gia_ManObj(p,iVar13), pGVar9 == (Gia_Obj_t *)0x0)) {
            return;
          }
          iVar4 = Vec_IntEntry(p->vGateClasses,iVar13);
          if ((((iVar4 != 0) && (uVar3 = *(ulong *)pGVar9, (~uVar3 & 0x1fffffff1fffffff) != 0)) &&
              ((uVar5 = (uint)uVar3, (~uVar5 & 0x9fffffff) != 0 ||
               ((int)((uint)(uVar3 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)))) &&
             (((int)uVar5 < 0 || ((uVar5 & 0x1fffffff) == 0x1fffffff)))) break;
          iVar13 = iVar13 + 1;
        }
        __assert_fail("Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkAig.c"
                      ,0x121,"void Nwk_ManDeriveMinCut(Gia_Man_t *, int)");
      }
      iVar13 = *piVar11;
      iVar4 = *piVar12;
      if (iVar13 != iVar4) break;
      piVar11 = piVar11 + 1;
      pVVar7 = p_01;
      iVar4 = iVar13;
LAB_00713eab:
      Vec_IntPush(pVVar7,iVar4);
      piVar12 = piVar12 + 1;
    }
    pVVar7 = local_58;
    if (iVar4 <= iVar13) goto LAB_00713eab;
    piVar11 = piVar11 + 1;
    Vec_IntPush(p_02,iVar13);
  } while( true );
}

Assistant:

void Nwk_ManDeriveMinCut( Gia_Man_t * p, int fVerbose )
{
    Nwk_Man_t * pNtk;
    Nwk_Obj_t * pNode;
    Vec_Ptr_t * vMinCut;
    Vec_Int_t * vPPis, * vNodes, * vLeaves, * vNodes2, * vLeaves2, * vMapInv;
    Vec_Int_t * vCommon, * vDiff0, * vDiff1;
    Gia_Obj_t * pObj;
    int i, iObjId;
    // get inputs
    Gia_ManGlaCollect( p, p->vGateClasses, NULL, &vPPis, NULL, NULL );
    // collect nodes rechable from PPIs
    vNodes = Vec_IntAlloc( 100 );
    vLeaves = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
        Nwk_ManColleacReached_rec( p, pObj, vNodes, vLeaves );
    // derive the new network
    pNtk = Nwk_ManCreateFromGia( p, vPPis, vNodes, vLeaves, &vMapInv );
    assert( Nwk_ManPiNum(pNtk) == Nwk_ManPoNum(pNtk) );
    // create min-cut
    vMinCut = Nwk_ManRetimeCutBackward( pNtk, Nwk_ManPiNum(pNtk), fVerbose );
    // copy from the GIA back
//    Aig_ManForEachObj( p, pObj, i )
//        ((Nwk_Obj_t *)pObj->pData)->pCopy = pObj;
    // mark min-cut nodes
    vNodes2 = Vec_IntAlloc( 100 );
    vLeaves2 = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vMinCut, pNode, i )
    {
        pObj = Gia_ManObj( p, Vec_IntEntry(vMapInv, Nwk_ObjId(pNode)) );
        if ( Gia_ObjIsConst0(pObj) )
            continue;
        Nwk_ManColleacReached_rec( p, pObj, vNodes2, vLeaves2 );
    }
    if ( fVerbose )
        printf( "Min-cut: %d -> %d.  Nodes %d -> %d.  ", Vec_IntSize(vPPis)+1, Vec_PtrSize(vMinCut), Vec_IntSize(vNodes), Vec_IntSize(vNodes2) );
    Vec_IntFree( vPPis );
    Vec_PtrFree( vMinCut );
    Vec_IntFree( vMapInv );
    Nwk_ManFree( pNtk );

    // sort the results
    Vec_IntSort( vNodes, 0 );
    Vec_IntSort( vNodes2, 0 );
    vCommon = Vec_IntAlloc( Vec_IntSize(vNodes) );
    vDiff0 = Vec_IntAlloc( 100 );
    vDiff1 = Vec_IntAlloc( 100 );
    Vec_IntTwoSplit( vNodes, vNodes2, vCommon, vDiff0, vDiff1 );
    if ( fVerbose )
        printf( "Common = %d.  Diff0 = %d. Diff1 = %d.\n", Vec_IntSize(vCommon), Vec_IntSize(vDiff0), Vec_IntSize(vDiff1) );

    // fill in
    Vec_IntForEachEntry( vDiff0, iObjId, i )
        Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );

    Vec_IntFree( vLeaves );
    Vec_IntFree( vNodes );
    Vec_IntFree( vLeaves2 );
    Vec_IntFree( vNodes2 );

    Vec_IntFree( vCommon );
    Vec_IntFree( vDiff0 );
    Vec_IntFree( vDiff1 );

    // check abstraction
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Vec_IntEntry( p->vGateClasses, i ) == 0 )
            continue;
        assert( Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj) );
    }
}